

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encodemv.c
# Opt level: O3

void av1_build_nmv_component_cost_table
               (int *mvcost,nmv_component *mvcomp,MvSubpelPrecision precision)

{
  int iVar1;
  bool bVar2;
  uint uVar3;
  ulong uVar4;
  int *piVar5;
  long lVar6;
  long lVar7;
  int iVar8;
  long lVar9;
  int iVar10;
  bool bVar11;
  int iVar12;
  long lVar13;
  int iVar14;
  uint uVar15;
  long lVar16;
  aom_cdf_prob (*cdf) [3];
  int iVar17;
  int class0_hp_cost [2];
  int hp_cost [2];
  int class0_cost [2];
  int sign_cost [2];
  int cost_swap [10];
  int fp_cost [4];
  int class0_fp_cost [2] [4];
  int class_cost [11];
  int bits_cost [10] [2];
  int local_160 [4];
  int local_150 [3];
  int local_144;
  int local_140;
  int local_13c;
  int local_118 [12];
  int local_e8 [13];
  int aiStack_b4 [9];
  int local_90;
  int aiStack_8c [23];
  
  local_e8[8] = 0;
  local_e8[9] = 0;
  local_e8[10] = 0;
  local_e8[0xb] = 0;
  local_e8[4] = 0;
  local_e8[5] = 0;
  local_e8[6] = 0;
  local_e8[7] = 0;
  local_e8[0] = 0;
  local_e8[1] = 0;
  local_e8[2] = 0;
  local_e8[3] = 0;
  lVar9 = 0;
  local_160[0] = 0;
  local_160[1] = 0;
  local_150[0] = 0;
  local_150[1] = 0;
  av1_cost_tokens_from_cdf(&local_140,mvcomp->sign_cdf,(int *)0x0);
  av1_cost_tokens_from_cdf(local_e8 + 0xc,mvcomp->classes_cdf,(int *)0x0);
  av1_cost_tokens_from_cdf(local_150 + 2,mvcomp->class0_cdf,(int *)0x0);
  cdf = mvcomp->bits_cdf;
  do {
    av1_cost_tokens_from_cdf((int *)((long)aiStack_8c + lVar9 + 4),*cdf,(int *)0x0);
    cdf = cdf + 1;
    lVar9 = lVar9 + 8;
  } while (lVar9 != 0x50);
  if (-1 < precision) {
    av1_cost_tokens_from_cdf(local_e8 + 4,mvcomp->class0_fp_cdf[0],(int *)0x0);
    av1_cost_tokens_from_cdf(local_e8 + 8,mvcomp->class0_fp_cdf[1],(int *)0x0);
    av1_cost_tokens_from_cdf(local_e8,mvcomp->fp_cdf,(int *)0x0);
    if (precision != '\0') {
      av1_cost_tokens_from_cdf(local_160,mvcomp->class0_hp_cdf,(int *)0x0);
      av1_cost_tokens_from_cdf(local_150,mvcomp->hp_cdf,(int *)0x0);
    }
  }
  local_118[4] = 0;
  local_118[5] = 0;
  local_118[6] = 0;
  local_118[7] = 0;
  local_118[0] = 0;
  local_118[1] = 0;
  local_118[2] = 0;
  local_118[3] = 0;
  local_118[8] = 0;
  local_118[9] = 0;
  uVar4 = 1;
  do {
    iVar12 = aiStack_8c[uVar4 * 2];
    local_118[uVar4] = iVar12;
    if (1 < uVar4) {
      local_118[uVar4] = iVar12 - local_e8[uVar4 + 0xb];
    }
    uVar4 = uVar4 + 1;
  } while (uVar4 != 10);
  lVar9 = 0;
  do {
    *(ulong *)(mvcost + lVar9 * 2 + 1) =
         CONCAT44(local_e8[lVar9] + local_140 + SUB84(local_150._0_8_,4),
                  local_e8[lVar9] + local_140 + (int)local_150._0_8_);
    lVar9 = lVar9 + 1;
  } while (lVar9 != 4);
  iVar12 = local_13c - local_140;
  *mvcost = 0;
  lVar16 = 1;
  lVar9 = 0;
  do {
    uVar3 = 8 << ((byte)lVar9 & 0x1f);
    iVar10 = 0;
    if (lVar9 != 0) {
      iVar10 = local_e8[lVar9 + 0xc];
    }
    iVar8 = aiStack_8c[lVar9 * 2 + 1];
    lVar6 = 0;
    iVar17 = 0;
    do {
      iVar14 = 8 << ((byte)lVar6 & 0x1f);
      iVar1 = local_118[lVar6];
      if (iVar17 < iVar14) {
        lVar7 = (long)iVar17;
        lVar13 = -((ulong)(iVar17 + uVar3) << 0x20);
        do {
          lVar13 = lVar13 + -0x100000000;
          iVar17 = mvcost[lVar7 + 1] + iVar10 + iVar1;
          mvcost[(ulong)uVar3 + lVar7 + 1] = iVar17;
          lVar7 = lVar7 + 1;
          *(int *)((long)mvcost + (lVar13 >> 0x1e)) = iVar17 + iVar12;
          iVar17 = iVar14;
        } while (iVar14 != lVar7);
      }
      local_118[lVar6] = iVar1 + iVar8;
      lVar6 = lVar6 + 1;
    } while (lVar6 != lVar16);
    lVar9 = lVar9 + 1;
    lVar16 = lVar16 + 1;
  } while (lVar9 != 10);
  lVar9 = 0;
  uVar3 = 0;
  do {
    uVar15 = 8 << ((byte)lVar9 & 0x1f);
    if ((int)uVar3 < (int)uVar15) {
      iVar10 = local_118[lVar9];
      uVar4 = (ulong)(int)uVar3;
      piVar5 = mvcost + (-0x2001 - uVar4);
      do {
        iVar8 = mvcost[uVar4 + 1] + local_90 + iVar10;
        mvcost[uVar4 + 0x2001] = iVar8;
        uVar4 = uVar4 + 1;
        *piVar5 = iVar8 + iVar12;
        piVar5 = piVar5 + -1;
        uVar3 = uVar15;
      } while (uVar15 != uVar4);
    }
    lVar9 = lVar9 + 1;
  } while (lVar9 != 10);
  if ((int)uVar3 < 0x1fff) {
    lVar9 = (long)(int)uVar3;
    piVar5 = mvcost + (-0x2001 - lVar9);
    do {
      iVar10 = mvcost[lVar9 + 1] + (aiStack_8c[0x14] - aiStack_b4[8]) + local_90;
      mvcost[lVar9 + 0x2001] = iVar10;
      lVar9 = lVar9 + 1;
      *piVar5 = iVar10 + iVar12;
      piVar5 = piVar5 + -1;
    } while (lVar9 != 0x1fff);
  }
  lVar9 = 0;
  piVar5 = local_150 + 2;
  bVar2 = true;
  do {
    bVar11 = bVar2;
    iVar12 = *piVar5;
    piVar5 = mvcost + lVar9 * -8 + -1;
    lVar16 = 0;
    do {
      iVar10 = *(int *)((long)local_e8 + lVar16 + lVar9 * 0x10 + 0x10) + local_e8[0xc] + iVar12;
      iVar8 = local_160[0] + iVar10;
      *(int *)((long)mvcost + lVar16 * 2 + lVar9 * 0x20 + 4) = iVar8 + local_140;
      *piVar5 = iVar8 + local_13c;
      iVar10 = iVar10 + local_160[1];
      *(int *)((long)mvcost + lVar16 * 2 + lVar9 * 0x20 + 8) = iVar10 + local_140;
      piVar5[-1] = iVar10 + local_13c;
      lVar16 = lVar16 + 4;
      piVar5 = piVar5 + -2;
    } while (lVar16 != 0x10);
    lVar9 = 1;
    piVar5 = &local_144;
    bVar2 = false;
  } while (bVar11);
  return;
}

Assistant:

void av1_build_nmv_component_cost_table(int *mvcost,
                                        const nmv_component *const mvcomp,
                                        MvSubpelPrecision precision) {
  int i, j, v, o, mantissa;
  int sign_cost[2], class_cost[MV_CLASSES], class0_cost[CLASS0_SIZE];
  int bits_cost[MV_OFFSET_BITS][2];
  int class0_fp_cost[CLASS0_SIZE][MV_FP_SIZE] = { 0 },
      fp_cost[MV_FP_SIZE] = { 0 };
  int class0_hp_cost[2] = { 0 }, hp_cost[2] = { 0 };

  av1_cost_tokens_from_cdf(sign_cost, mvcomp->sign_cdf, NULL);
  av1_cost_tokens_from_cdf(class_cost, mvcomp->classes_cdf, NULL);
  av1_cost_tokens_from_cdf(class0_cost, mvcomp->class0_cdf, NULL);
  for (i = 0; i < MV_OFFSET_BITS; ++i) {
    av1_cost_tokens_from_cdf(bits_cost[i], mvcomp->bits_cdf[i], NULL);
  }

  if (precision > MV_SUBPEL_NONE) {
    for (i = 0; i < CLASS0_SIZE; ++i)
      av1_cost_tokens_from_cdf(class0_fp_cost[i], mvcomp->class0_fp_cdf[i],
                               NULL);
    av1_cost_tokens_from_cdf(fp_cost, mvcomp->fp_cdf, NULL);
  }

  if (precision > MV_SUBPEL_LOW_PRECISION) {
    av1_cost_tokens_from_cdf(class0_hp_cost, mvcomp->class0_hp_cdf, NULL);
    av1_cost_tokens_from_cdf(hp_cost, mvcomp->hp_cdf, NULL);
  }

  // Instead of accumulating the cost of each vector component's bits
  //   individually, compute the costs based on smaller vectors. Costs for
  //   [2^exp, 2 * 2^exp - 1] are calculated based on [0, 2^exp - 1]
  //   respectively. Offsets are maintained to swap both 1) class costs when
  //   treated as a complete vector component with the highest set bit when
  //   treated as a mantissa (significand) and 2) leading zeros to account for
  //   the current exponent.

  // Cost offsets
  int cost_swap[MV_OFFSET_BITS] = { 0 };
  // Delta to convert positive vector to negative vector costs
  int negate_sign = sign_cost[1] - sign_cost[0];

  // Initialize with offsets to swap the class costs with the costs of the
  //   highest set bit.
  for (i = 1; i < MV_OFFSET_BITS; ++i) {
    cost_swap[i] = bits_cost[i - 1][1];
    if (i > CLASS0_BITS) cost_swap[i] -= class_cost[i - CLASS0_BITS];
  }

  // Seed the fractional costs onto the output (overwritten latter).
  for (o = 0; o < MV_FP_SIZE; ++o) {
    int hp;
    for (hp = 0; hp < 2; ++hp) {
      v = 2 * o + hp + 1;
      mvcost[v] = fp_cost[o] + hp_cost[hp] + sign_cost[0];
    }
  }

  mvcost[0] = 0;
  // Fill the costs for each exponent's vectors, using the costs set in the
  //   previous exponents.
  for (i = 0; i < MV_OFFSET_BITS; ++i) {
    const int exponent = (2 * MV_FP_SIZE) << i;

    int class = 0;
    if (i >= CLASS0_BITS) {
      class = class_cost[i - CLASS0_BITS + 1];
    }

    // Iterate through mantissas, keeping track of the location
    //   of the highest set bit for the mantissa.
    // To be clear: in the outer loop, the position of the highest set bit
    //   (exponent) is tracked and, in this loop, the highest set bit of the
    //   mantissa is tracked.
    mantissa = 0;
    for (j = 0; j <= i; ++j) {
      for (; mantissa < (2 * MV_FP_SIZE) << j; ++mantissa) {
        int cost = mvcost[mantissa + 1] + class + cost_swap[j];
        v = exponent + mantissa + 1;
        mvcost[v] = cost;
        mvcost[-v] = cost + negate_sign;
      }
      cost_swap[j] += bits_cost[i][0];
    }
  }

  // Special case to avoid buffer overrun
  {
    int exponent = (2 * MV_FP_SIZE) << MV_OFFSET_BITS;
    int class = class_cost[MV_CLASSES - 1];
    mantissa = 0;
    for (j = 0; j < MV_OFFSET_BITS; ++j) {
      for (; mantissa < (2 * MV_FP_SIZE) << j; ++mantissa) {
        int cost = mvcost[mantissa + 1] + class + cost_swap[j];
        v = exponent + mantissa + 1;
        mvcost[v] = cost;
        mvcost[-v] = cost + negate_sign;
      }
    }
    // At this point: mantissa = exponent >> 1

    // Manually calculate the final cost offset
    int cost_swap_hi =
        bits_cost[MV_OFFSET_BITS - 1][1] - class_cost[MV_CLASSES - 2];
    for (; mantissa < exponent - 1; ++mantissa) {
      int cost = mvcost[mantissa + 1] + class + cost_swap_hi;
      v = exponent + mantissa + 1;
      mvcost[v] = cost;
      mvcost[-v] = cost + negate_sign;
    }
  }

  // Fill costs for class0 vectors, overwriting previous placeholder values
  //   used for calculating the costs of the larger vectors.
  for (i = 0; i < CLASS0_SIZE; ++i) {
    const int top = i * 2 * MV_FP_SIZE;
    for (o = 0; o < MV_FP_SIZE; ++o) {
      int hp;
      int cost = class0_fp_cost[i][o] + class_cost[0] + class0_cost[i];
      for (hp = 0; hp < 2; ++hp) {
        v = top + 2 * o + hp + 1;
        mvcost[v] = cost + class0_hp_cost[hp] + sign_cost[0];
        mvcost[-v] = cost + class0_hp_cost[hp] + sign_cost[1];
      }
    }
  }
}